

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O1

HaF32 * __thiscall
HACD::MyWuQuantizer::wuQuantize3D
          (MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices,bool denormalizeResults,
          HaU32 maxVertices,HaU32 *outputCount)

{
  Vec3Vector *outputVertices;
  HaU32 *pHVar1;
  HaU32 HVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Vec3 *pVVar8;
  long lVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong uVar12;
  WuColorQuantizer wcq;
  WuColorQuantizer local_458;
  
  *outputCount = 0;
  normalizeInput(this,vcount,vertices);
  WuColorQuantizer::WuColorQuantizer(&local_458);
  if (vcount != 0) {
    lVar9 = 8;
    uVar12 = 0;
    do {
      if ((this->mNormalizedInput).mSize <= uVar12) goto LAB_0086ee89;
      pVVar8 = (this->mNormalizedInput).mData;
      WuColorQuantizer::addColor
                (&local_458,*(HaF32 *)((long)pVVar8 + lVar9 + -8),
                 *(HaF32 *)((long)pVVar8 + lVar9 + -4),*(HaF32 *)((long)&pVVar8->x + lVar9));
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0xc;
    } while (vcount != uVar12);
  }
  outputVertices = &this->mQuantizedOutput;
  WuColorQuantizer::Quantize(&local_458,maxVertices,outputVertices);
  HVar2 = (this->mQuantizedOutput).mSize;
  *outputCount = HVar2;
  if (HVar2 == 0) {
    pVVar8 = (Vec3 *)0x0;
  }
  else {
    if ((denormalizeResults) && (*outputCount != 0)) {
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar3 = (this->mQuantizedOutput).mSize;
        if (uVar3 <= uVar12) goto LAB_0086ee89;
        pVVar8 = (this->mQuantizedOutput).mData;
        auVar5 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).x),
                                 ZEXT416(*(uint *)((long)&pVVar8->x + lVar9)),
                                 ZEXT416((uint)(this->mCenter).x));
        *(int *)((long)&pVVar8->x + lVar9) = auVar5._0_4_;
        auVar6 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).y),auVar5,
                                 ZEXT416((uint)(this->mCenter).y));
        *(int *)((long)&pVVar8->y + lVar9) = auVar6._0_4_;
        auVar5 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).z),auVar5,
                                 ZEXT416((uint)(this->mCenter).z));
        *(int *)((long)&pVVar8->z + lVar9) = auVar5._0_4_;
        uVar11 = (this->mQuantizedOutput).mCapacity;
        uVar7 = uVar11 & 0x7fffffff;
        if (uVar7 <= uVar3) {
          uVar11 = uVar11 * 2;
          if (uVar7 == 0) {
            uVar11 = 1;
          }
          if (uVar11 <= uVar7) {
            __assert_fail("this->capacity() < capacity",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                          ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
          }
          hacd::vector<HACD::Vec3>::recreate(outputVertices,uVar11);
        }
        puVar10 = (undefined8 *)((long)&pVVar8->x + lVar9);
        pVVar8 = (this->mQuantizedOutput).mData;
        uVar3 = (this->mQuantizedOutput).mSize;
        pVVar8[uVar3].z = *(HaF32 *)(puVar10 + 1);
        uVar4 = *puVar10;
        pVVar8 = pVVar8 + uVar3;
        pVVar8->x = (HaF32)(int)uVar4;
        pVVar8->y = (HaF32)(int)((ulong)uVar4 >> 0x20);
        pHVar1 = &(this->mQuantizedOutput).mSize;
        *pHVar1 = *pHVar1 + 1;
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 0xc;
      } while (uVar12 < *outputCount);
    }
    if ((this->mQuantizedOutput).mSize == 0) {
LAB_0086ee89:
      __assert_fail("i < mSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x93,"T &hacd::vector<HACD::Vec3>::operator[](HaU32) [T = HACD::Vec3]");
    }
    pVVar8 = outputVertices->mData;
  }
  WuColorQuantizer::~WuColorQuantizer(&local_458);
  return &pVVar8->x;
}

Assistant:

virtual const hacd::HaF32 * wuQuantize3D(hacd::HaU32 vcount,
		const hacd::HaF32 *vertices,
		bool denormalizeResults,
		hacd::HaU32 maxVertices,
		hacd::HaU32 &outputCount)
	{
		const hacd::HaF32 *ret = NULL;
		outputCount = 0;

		normalizeInput(vcount,vertices);

		WuColorQuantizer wcq;

		for (HaU32 i=0; i<vcount; i++)
		{
			const Vec3 &v = mNormalizedInput[i];
			wcq.addColor(v.x,v.y,v.z);
		}

		wcq.Quantize(maxVertices,mQuantizedOutput);

		outputCount = (HaU32)mQuantizedOutput.size();

		if ( outputCount > 0 )
		{
			if ( denormalizeResults )
			{
				for (HaU32 i=0; i<outputCount; i++)
				{
					Vec3 &v = mQuantizedOutput[i];
					v.x = v.x*mScale.x + mCenter.x;
					v.y = v.x*mScale.y + mCenter.y;
					v.z = v.x*mScale.z + mCenter.z;
					mQuantizedOutput.push_back(v);
				}
			}
			ret = &mQuantizedOutput[0].x;
		}


		return ret;
	}